

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

bool __thiscall
sf::priv::WindowImplX11::checkXRandR(WindowImplX11 *this,int *xRandRMajor,int *xRandRMinor)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_2c [4];
  int *piStack_28;
  int version;
  int *xRandRMinor_local;
  int *xRandRMajor_local;
  WindowImplX11 *this_local;
  
  piStack_28 = xRandRMinor;
  xRandRMinor_local = xRandRMajor;
  xRandRMajor_local = (int *)this;
  iVar1 = XQueryExtension(this->m_display,"RANDR",local_2c,local_2c);
  if (iVar1 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"XRandR extension is not supported");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    iVar1 = XRRQueryVersion(this->m_display,xRandRMinor_local,piStack_28);
    if (((iVar1 == 0) || (*xRandRMinor_local < 1)) ||
       ((*xRandRMinor_local == 1 && (*piStack_28 < 2)))) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"XRandR is too old");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool WindowImplX11::checkXRandR(int& xRandRMajor, int& xRandRMinor)
{
    // Check if the XRandR extension is present
    int version;
    if (!XQueryExtension(m_display, "RANDR", &version, &version, &version))
    {
        err() << "XRandR extension is not supported" << std::endl;
        return false;
    }

    // Check XRandR version, 1.2 required
    if (!XRRQueryVersion(m_display, &xRandRMajor, &xRandRMinor) || xRandRMajor < 1 || (xRandRMajor == 1 && xRandRMinor < 2 ))
    {
        err() << "XRandR is too old" << std::endl;
        return false;
    }

    return true;
}